

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool mjs::interpreter::impl::compare_strict_equal(value *l,value *r)

{
  bool bVar1;
  bool bVar2;
  value_type vVar3;
  value_type vVar4;
  uint uVar5;
  string *l_00;
  string *r_00;
  object_ptr *poVar6;
  object *poVar7;
  object *poVar8;
  double __value;
  double __value_00;
  bool local_36;
  bool local_35;
  double y;
  double x;
  value *r_local;
  value *l_local;
  
  vVar3 = value::type(l);
  vVar4 = value::type(r);
  if (vVar3 == vVar4) {
    vVar3 = value::type(l);
    if (vVar3 == undefined) {
      l_local._7_1_ = true;
    }
    else {
      vVar3 = value::type(l);
      if (vVar3 == null) {
        l_local._7_1_ = true;
      }
      else {
        vVar3 = value::type(l);
        if (vVar3 == number) {
          __value = value::number_value(l);
          __value_00 = value::number_value(r);
          uVar5 = std::isnan(__value);
          if (((uVar5 & 1) == 0) && (uVar5 = std::isnan(__value_00), (uVar5 & 1) == 0)) {
            local_35 = true;
            if ((__value != __value_00) || (NAN(__value) || NAN(__value_00))) {
              local_36 = false;
              if ((__value == 0.0) && (!NAN(__value))) {
                local_36 = __value_00 == 0.0;
              }
              local_35 = local_36;
            }
            l_local._7_1_ = local_35;
          }
          else {
            l_local._7_1_ = false;
          }
        }
        else {
          vVar3 = value::type(l);
          if (vVar3 == string) {
            l_00 = value::string_value(l);
            r_00 = value::string_value(r);
            l_local._7_1_ = mjs::operator==(l_00,r_00);
          }
          else {
            vVar3 = value::type(l);
            if (vVar3 == boolean) {
              bVar1 = value::boolean_value(l);
              bVar2 = value::boolean_value(r);
              l_local._7_1_ = bVar1 == bVar2;
            }
            else {
              vVar3 = value::type(l);
              if (vVar3 != object) {
                __assert_fail("l.type() == value_type::object",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                              ,0x2b7,
                              "static bool mjs::interpreter::impl::compare_strict_equal(const value &, const value &)"
                             );
              }
              poVar6 = value::object_value(l);
              poVar7 = gc_heap_ptr<mjs::object>::get(poVar6);
              poVar6 = value::object_value(r);
              poVar8 = gc_heap_ptr<mjs::object>::get(poVar6);
              if (poVar7 == poVar8) {
                l_local._7_1_ = true;
              }
              else {
                l_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  else {
    l_local._7_1_ = false;
  }
  return l_local._7_1_;
}

Assistant:

static bool compare_strict_equal(const value& l, const value& r) {
        if (l.type() != r.type()) return false;
        if (l.type() == value_type::undefined) return true;
        if (l.type() == value_type::null) return true;
        if (l.type() == value_type::number) {
            const auto x = l.number_value(), y = r.number_value();
            if (std::isnan(x) || std::isnan(y)) return false;
            return x==y || (x==0.0 && y == 0.0);
        } else if (l.type() == value_type::string) {
            return l.string_value() == r.string_value();
        } else if (l.type() == value_type::boolean) {
            return l.boolean_value() == r.boolean_value();
        }
        assert(l.type() == value_type::object);
        if (l.object_value().get() == r.object_value().get()) {
            return true;
        }
        // TODO: Return true if they refer to objects joined to each other (see §13.1.2).
        return false;
    }